

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::onDetach(Assembler *this,CodeHolder *code)

{
  Error EVar1;
  CodeHolder *in_RSI;
  CodeEmitter *in_RDI;
  
  in_RDI[1]._vptr_CodeEmitter = (_func_int **)0x0;
  in_RDI[1]._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  in_RDI[1]._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  in_RDI[1]._codeInfo._baseAddress = 0;
  in_RDI[1]._code = (CodeHolder *)0x0;
  in_RDI[1]._nextEmitter = (CodeEmitter *)0x0;
  in_RDI[1]._type = '\0';
  in_RDI[1]._destroyed = '\0';
  in_RDI[1]._finalized = '\0';
  in_RDI[1]._reserved = '\0';
  in_RDI[1]._lastError = 0;
  in_RDI[1]._privateData = 0;
  in_RDI[1]._globalHints = 0;
  in_RDI[1]._globalOptions = 0;
  in_RDI[1]._options = 0;
  EVar1 = CodeEmitter::onDetach(in_RDI,in_RSI);
  return EVar1;
}

Assistant:

Error Assembler::onDetach(CodeHolder* code) noexcept {
  _section    = nullptr;
  _bufferData = nullptr;
  _bufferEnd  = nullptr;
  _bufferPtr  = nullptr;

  _op4.reset();
  _op5.reset();

  return Base::onDetach(code);
}